

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O1

void __thiscall
APowerDamage::ModifyDamage
          (APowerDamage *this,int damage,FName *damageType,int *newdamage,bool passive)

{
  PType *this_00;
  AInventory *pAVar1;
  bool bVar2;
  int iVar3;
  hash_t hVar4;
  int iVar5;
  undefined4 extraout_var;
  AActor *pAVar6;
  int local_3c;
  FSoundID local_38;
  FName local_34;
  
  if (damage < 1 || passive) goto LAB_005e0448;
  if ((this->super_APowerup).super_AInventory.super_AActor.super_DThinker.super_DObject.Class ==
      (PClass *)0x0) {
    iVar3 = (**(this->super_APowerup).super_AInventory.super_AActor.super_DThinker.super_DObject.
               _vptr_DObject)(this);
    (this->super_APowerup).super_AInventory.super_AActor.super_DThinker.super_DObject.Class =
         (PClass *)CONCAT44(extraout_var,iVar3);
  }
  this_00 = (this->super_APowerup).super_AInventory.super_AActor.super_DThinker.super_DObject.Class
            [1].super_PStruct.super_PNamedType.super_PCompoundType.super_PType.HashNext;
  if ((this_00 == (PType *)0x0) ||
     (hVar4 = TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>::CountUsed
                        ((TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_> *)this_00),
     hVar4 == 0)) {
    iVar3 = damage * 4;
  }
  else {
    local_34 = (FName)damageType->Index;
    iVar5 = DmgFactors::Apply((DmgFactors *)this_00,&local_34,damage);
    iVar3 = 1;
    if (1 < iVar5) {
      iVar3 = iVar5;
    }
  }
  pAVar6 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
  if (pAVar6 == (AActor *)0x0) {
LAB_005e03f5:
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0) {
      (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
      goto LAB_005e03f5;
    }
  }
  if ((bVar2) && (damage < iVar3)) {
    pAVar6 = (this->super_APowerup).super_AInventory.Owner.field_0.p;
    if ((pAVar6 != (AActor *)0x0) &&
       (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (this->super_APowerup).super_AInventory.Owner.field_0.p = (AActor *)0x0;
      pAVar6 = (AActor *)0x0;
    }
    local_38.ID = (this->super_APowerup).super_AInventory.super_AActor.ActiveSound.super_FSoundID.ID
    ;
    S_Sound(pAVar6,5,&local_38,1.0,0.0);
  }
  *newdamage = iVar3;
LAB_005e0448:
  pAVar1 = (this->super_APowerup).super_AInventory.super_AActor.Inventory.field_0.p;
  if (pAVar1 != (AInventory *)0x0) {
    if (((pAVar1->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
      pAVar1 = (this->super_APowerup).super_AInventory.super_AActor.Inventory.field_0.p;
      local_3c = damageType->Index;
      (*(pAVar1->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x3c])
                (pAVar1,damage,&local_3c,newdamage,passive);
    }
    else {
      (this->super_APowerup).super_AInventory.super_AActor.Inventory.field_0.p = (AInventory *)0x0;
    }
  }
  return;
}

Assistant:

void APowerDamage::ModifyDamage(int damage, FName damageType, int &newdamage, bool passive)
{
	if (!passive && damage > 0)
	{
		int newdam;
		DmgFactors *df = GetClass()->DamageFactors;
		if (df != NULL && df->CountUsed() != 0)
		{
			newdam = MAX(1, df->Apply(damageType, damage));// don't allow zero damage as result of an underflow
		}
		else
		{
			newdam = damage * 4;
		}
		if (Owner != NULL && newdam > damage) S_Sound(Owner, 5, ActiveSound, 1.0f, ATTN_NONE);
		newdamage = newdam;
	}
	if (Inventory != NULL) Inventory->ModifyDamage(damage, damageType, newdamage, passive);
}